

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleRowDown4_AVX2(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [32];
  bool bVar2;
  undefined1 auVar3 [32];
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 in_ZMM5 [64];
  int dst_width_local;
  uint8_t *dst_ptr_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  auVar6 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar6 = vpsrld_avx2(auVar6,0x18);
  auVar6 = vpslld_avx2(auVar6,0x10);
  do {
    auVar5 = *(undefined1 (*) [32])src_ptr;
    pauVar1 = (undefined1 (*) [32])((long)src_ptr + 0x20);
    src_ptr = (uint8_t *)((long)src_ptr + 0x40);
    auVar5 = vpand_avx2(auVar5,auVar6);
    auVar3 = vpand_avx2(*pauVar1,auVar6);
    auVar5 = vpackuswb_avx2(auVar5,auVar3);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    auVar5 = vpsrlw_avx2(auVar5,8);
    auVar5 = vpackuswb_avx2(auVar5,auVar5);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    *(undefined1 (*) [16])dst_ptr = auVar5._0_16_;
    dst_ptr = (uint8_t *)((long)dst_ptr + 0x10);
    iVar4 = dst_width + -0x10;
    bVar2 = 0xf < dst_width;
    dst_width = iVar4;
  } while (iVar4 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown4_AVX2(const uint8_t* src_ptr,
                        ptrdiff_t src_stride,
                        uint8_t* dst_ptr,
                        int dst_width) {
  (void)src_stride;
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsrld      $0x18,%%ymm5,%%ymm5           \n"
      "vpslld      $0x10,%%ymm5,%%ymm5           \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpand       %%ymm5,%%ymm0,%%ymm0          \n"
      "vpand       %%ymm5,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm5");
}